

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O2

bool run_test_type_conversion<std::shared_ptr<long>&>(Boxed_Value *bv,bool expectedpass)

{
  element_type *peVar1;
  __shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> *local_38;
  long local_30;
  __shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  chaiscript::boxed_cast<std::shared_ptr<long>&>
            ((chaiscript *)&local_38,bv,(Type_Conversions_State *)0x0);
  peVar1 = local_38->_M_ptr;
  *(element_type **)(local_30 + 0x20) = peVar1;
  *(element_type **)(local_30 + 0x28) = peVar1;
  std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_28,local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return expectedpass;
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}